

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

void do_weighting<sparse_parameters>
               (vw *all,uint64_t length,float *local_weights,sparse_parameters *weights)

{
  weight *pwVar1;
  sparse_parameters *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  float fVar2;
  size_t in_stack_00000008;
  sparse_parameters *in_stack_00000010;
  float ratio;
  float *weight;
  uint64_t i;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    sparse_parameters::stride_shift(in_RCX);
    pwVar1 = sparse_parameters::operator[](in_stack_00000010,in_stack_00000008);
    if (*(float *)(in_RDX + local_28 * 4) <= 0.0) {
      *(undefined4 *)(in_RDX + local_28 * 4) = 0;
      *pwVar1 = 0.0;
    }
    else {
      fVar2 = pwVar1[1] / *(float *)(in_RDX + local_28 * 4);
      *(float *)(in_RDX + local_28 * 4) = *pwVar1 * fVar2;
      *pwVar1 = fVar2 * *pwVar1;
      pwVar1[1] = fVar2 * pwVar1[1];
      if ((*(byte *)(in_RDI + 0x343d) & 1) != 0) {
        pwVar1[*(long *)(in_RDI + 0x3470)] = fVar2 * pwVar1[*(long *)(in_RDI + 0x3470)];
      }
    }
  }
  return;
}

Assistant:

void do_weighting(vw& all, uint64_t length, float* local_weights, T& weights)
{
  for (uint64_t i = 0; i < length; i++)
  {
    float* weight = &weights[i << weights.stride_shift()];
    if (local_weights[i] > 0)
    {
      float ratio = weight[1] / local_weights[i];
      local_weights[i] = weight[0] * ratio;
      weight[0] *= ratio;
      weight[1] *= ratio;  // A crude max
      if (all.normalized_updates)
        weight[all.normalized_idx] *= ratio;  // A crude max
    }
    else
    {
      local_weights[i] = 0;
      *weight = 0;
    }
  }
}